

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkItem.h
# Opt level: O2

void __thiscall cmLinkImplItem::cmLinkImplItem(cmLinkImplItem *this)

{
  (this->super_cmLinkItem).super_string._M_dataplus._M_p =
       (pointer)&(this->super_cmLinkItem).super_string.field_2;
  (this->super_cmLinkItem).super_string._M_string_length = 0;
  (this->super_cmLinkItem).super_string.field_2._M_local_buf[0] = '\0';
  (this->super_cmLinkItem).Target = (cmGeneratorTarget *)0x0;
  cmListFileBacktrace::cmListFileBacktrace(&this->Backtrace);
  this->FromGenex = false;
  return;
}

Assistant:

cmLinkImplItem()
    : cmLinkItem()
    , Backtrace()
    , FromGenex(false)
  {
  }